

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

bool __thiscall
QSqlTableModel::removeRows(QSqlTableModel *this,int row,int count,QModelIndex *parent)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  ModifiedRow *this_00;
  long in_FS_OFFSET;
  QSqlRecord local_88;
  int row_local;
  ModifiedRow local_78;
  ModifiedRow local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
  row_local = row;
  bVar2 = QModelIndex::isValid(parent);
  if (((0 < count) && (!bVar2)) && (-1 < row)) {
    local_58.m_op = ~None;
    local_58._4_4_ = 0xffffffff;
    local_58.m_rec.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
         (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
    local_58.m_db_values.d.d.ptr =
         (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
         (totally_ordered_wrapper<QSqlRecordPrivate_*>)0x0;
    iVar4 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x78))(this);
    if (row + count <= iVar4) {
      if (*(int *)(lVar1 + 0x238) != 2) {
        if (1 < (uint)count) goto LAB_00136027;
        QSqlRecord::QSqlRecord(&local_88);
        QSqlTableModelPrivate::ModifiedRow::ModifiedRow(&local_78,None,&local_88);
        QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
                  (&local_58,(QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar1 + 0x2e0),
                   &row_local,&local_78);
        if (local_58.m_submitted == true) {
          bVar2 = isDirty(this);
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_58);
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_78);
          QSqlRecord::~QSqlRecord(&local_88);
          if (bVar2) goto LAB_00136027;
        }
        else {
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_58);
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_78);
          QSqlRecord::~QSqlRecord(&local_88);
        }
      }
      local_88.d.d.ptr._0_4_ = count + row_local;
LAB_00136075:
      iVar4 = (int)local_88.d.d.ptr + -1;
      if (row_local < (int)local_88.d.d.ptr) {
        local_88.d.d.ptr._0_4_ = iVar4;
        this_00 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
                            ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)(lVar1 + 0x2e0),
                             (int *)&local_88);
        if (this_00->m_op == None) {
          QSqlQueryModel::record((QSqlQueryModel *)&local_78,(Orientation)this);
          QSqlTableModelPrivate::ModifiedRow::ModifiedRow(&local_58,Delete,(QSqlRecord *)&local_78);
          QSqlTableModelPrivate::ModifiedRow::operator=(this_00,&local_58);
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow(&local_58);
          QSqlRecord::~QSqlRecord((QSqlRecord *)&local_78);
        }
        else {
          if (this_00->m_op == Insert) {
            (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1c0))(this,(int)local_88.d.d.ptr);
            goto LAB_00136075;
          }
          QSqlTableModelPrivate::ModifiedRow::setOp(this_00,Delete);
        }
        if (*(int *)(lVar1 + 0x238) == 2) {
          QAbstractItemModel::headerDataChanged((Orientation)this,2,(int)local_88.d.d.ptr);
        }
        goto LAB_00136075;
      }
      uVar3 = 1;
      local_88.d.d.ptr._0_4_ = iVar4;
      if (*(int *)(lVar1 + 0x238) != 2) {
        uVar3 = (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x170))(this);
      }
      goto LAB_00136029;
    }
  }
LAB_00136027:
  uVar3 = 0;
LAB_00136029:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QSqlTableModel::removeRows(int row, int count, const QModelIndex &parent)
{
    Q_D(QSqlTableModel);
    if (parent.isValid() || row < 0 || count <= 0 || row + count > rowCount())
        return false;

    if (d->strategy != OnManualSubmit)
        if (count > 1 || (d->cache.value(row).submitted() && isDirty()))
            return false;

    // Iterate backwards so we don't have to worry about removed rows causing
    // higher cache entries to shift downwards.
    for (int idx = row + count - 1; idx >= row; --idx) {
        QSqlTableModelPrivate::ModifiedRow& mrow = d->cache[idx];
        if (mrow.op() == QSqlTableModelPrivate::Insert) {
            revertRow(idx);
        } else {
            if (mrow.op() == QSqlTableModelPrivate::None)
                mrow = QSqlTableModelPrivate::ModifiedRow(QSqlTableModelPrivate::Delete,
                                                          QSqlQueryModel::record(idx));
            else
                mrow.setOp(QSqlTableModelPrivate::Delete);
            if (d->strategy == OnManualSubmit)
                emit headerDataChanged(Qt::Vertical, idx, idx);
        }
    }

    if (d->strategy != OnManualSubmit)
        return submit();

    return true;
}